

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O1

dropt_char * dropt_get_help(dropt_context *context,dropt_help_params *helpParams)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  dropt_stringstream *ss;
  char *pcVar4;
  dropt_char *pdVar5;
  undefined8 extraout_RAX;
  undefined7 uVar6;
  uint uVar7;
  char *pcVar8;
  dropt_context *pdVar9;
  size_t sVar10;
  uint uVar11;
  dropt_option *option;
  bool bVar12;
  bool bVar13;
  ulong local_38;
  
  pdVar9 = context;
  ss = dropt_ssopen();
  if (context == (dropt_context *)0x0) {
    dropt_get_help_cold_1();
    if (pdVar9 != (dropt_context *)0x0) {
      pdVar9->options = (dropt_option *)0x600000002;
      *(undefined1 *)&pdVar9->numOptions = 1;
      return (dropt_char *)0x600000002;
    }
    dropt_init_help_params_cold_1();
    if (pdVar9 != (dropt_context *)0x0) {
      uVar6 = (undefined7)((ulong)extraout_RAX >> 8);
      if (((((pdVar9->numOptions == 0) && (*(char *)&pdVar9->options == '\0')) &&
           (pdVar9->sortedByLong == (option_proxy *)0x0)) &&
          ((pdVar9->sortedByShort == (option_proxy *)0x0 &&
           (*(long *)&pdVar9->allowConcatenatedArgs == 0)))) &&
         ((pdVar9->errorHandler == (dropt_error_handler_func)0x0 &&
          (*(int *)&pdVar9->errorHandlerData == 0)))) {
        return (dropt_char *)CONCAT71(uVar6,*(long *)&pdVar9->errorDetails != 0);
      }
      return (dropt_char *)CONCAT71(uVar6,1);
    }
    return (dropt_char *)0x0;
  }
  if (ss == (dropt_stringstream *)0x0) {
    return (dropt_char *)0x0;
  }
  if (helpParams == (dropt_help_params *)0x0) {
    uVar11 = 6;
    local_38 = 2;
    bVar12 = false;
  }
  else {
    uVar11 = helpParams->description_start_column;
    bVar12 = helpParams->blank_lines_between_options == '\0';
    local_38 = (ulong)CONCAT14(bVar12,helpParams->indent);
  }
  option = context->options;
  _Var1 = is_valid_option(option);
  if (_Var1) {
    do {
      pcVar8 = option->long_name;
      if (pcVar8 == (char *)0x0) {
        bVar13 = false;
      }
      else {
        bVar13 = *pcVar8 != '\0';
      }
      if ((option->description != (dropt_char *)0x0) && ((option->attr & 2) == 0)) {
        if ((bool)(option->short_name != '\0' & bVar13)) {
          uVar2 = dropt_ssprintf(ss,"%*s-%c, --%s",local_38 & 0xffffffff,"");
LAB_00102845:
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          if (option->arg_description != (dropt_char *)0x0) {
            pcVar8 = "[=%s]";
            if ((option->attr & 4) == 0) {
              pcVar8 = "=%s";
            }
            iVar3 = dropt_ssprintf(ss,pcVar8);
            if (iVar3 < 1) {
              iVar3 = 0;
            }
            uVar2 = uVar2 + iVar3;
          }
          if (uVar11 <= uVar2) {
            uVar2 = 0;
            dropt_ssprintf(ss,"\n");
          }
          pcVar8 = option->description;
          while (pcVar8 != (char *)0x0) {
            pcVar4 = strchr(pcVar8,10);
            if (pcVar4 == (char *)0x0) {
              sVar10 = strlen(pcVar8);
              pcVar4 = (char *)0x0;
            }
            else {
              sVar10 = (long)pcVar4 - (long)pcVar8;
              pcVar4 = pcVar4 + 1;
            }
            uVar7 = uVar11 - uVar2;
            uVar2 = 0;
            dropt_ssprintf(ss,"%*s%.*s\n",(ulong)uVar7,"",sVar10,pcVar8);
            pcVar8 = pcVar4;
          }
        }
        else {
          if (bVar13) {
            uVar2 = dropt_ssprintf(ss,"%*s--%s",local_38 & 0xffffffff,"",pcVar8);
            goto LAB_00102845;
          }
          if (option->short_name != '\0') {
            uVar2 = dropt_ssprintf(ss,"%*s-%c",local_38 & 0xffffffff,"");
            goto LAB_00102845;
          }
          dropt_ssprintf(ss,"%s\n");
        }
        if (!bVar12) {
          dropt_ssprintf(ss,"\n");
        }
      }
      option = option + 1;
      _Var1 = is_valid_option(option);
    } while (_Var1);
  }
  pdVar5 = dropt_ssfinalize(ss);
  return pdVar5;
}

Assistant:

dropt_char*
dropt_get_help(const dropt_context* context,
               const dropt_help_params* helpParams)
{
    dropt_char* helpText = NULL;
    dropt_stringstream* ss = dropt_ssopen();

    if (context == NULL)
    {
        DROPT_MISUSE("No dropt context specified.");
    }
    else if (ss != NULL)
    {
        const dropt_option* option;
        dropt_help_params hp;

        if (helpParams == NULL)
        {
            dropt_init_help_params(&hp);
        }
        else
        {
            hp = *helpParams;
        }

        for (option = context->options; is_valid_option(option); option++)
        {
            bool hasLongName =    option->long_name != NULL
                               && option->long_name[0] != DROPT_TEXT_LITERAL('\0');
            bool hasShortName = option->short_name != DROPT_TEXT_LITERAL('\0');

            /* The number of characters printed on the current line so far. */
            int n;

            if (   option->description == NULL
                || (option->attr & dropt_attr_hidden))
            {
                /* Undocumented option.  Ignore it and move on. */
                continue;
            }
            else if (hasLongName && hasShortName)
            {
                n = dropt_ssprintf(ss, DROPT_TEXT_LITERAL("%*s-%c, --%s"),
                                   hp.indent, DROPT_TEXT_LITERAL(""),
                                   option->short_name, option->long_name);
            }
            else if (hasLongName)
            {
                n = dropt_ssprintf(ss, DROPT_TEXT_LITERAL("%*s--%s"),
                                   hp.indent, DROPT_TEXT_LITERAL(""),
                                   option->long_name);
            }
            else if (hasShortName)
            {
                n = dropt_ssprintf(ss, DROPT_TEXT_LITERAL("%*s-%c"),
                                   hp.indent, DROPT_TEXT_LITERAL(""),
                                   option->short_name);
            }
            else
            {
                /* Comment text.  Don't bother with indentation. */
                assert(option->description != NULL);
                dropt_ssprintf(ss, DROPT_TEXT_LITERAL("%s\n"), option->description);
                goto next;
            }

            if (n < 0) { n = 0; }

            if (option->arg_description != NULL)
            {
                int m = dropt_ssprintf(ss,
                                       (option->attr & dropt_attr_optional_val)
                                       ? DROPT_TEXT_LITERAL("[=%s]")
                                       : DROPT_TEXT_LITERAL("=%s"),
                                       option->arg_description);
                if (m > 0) { n += m; }
            }

            /* Check for equality to make sure that there's at least one
             * space between the option name and its description.
             */
            if ((unsigned int) n >= hp.description_start_column)
            {
                dropt_ssprintf(ss, DROPT_TEXT_LITERAL("\n"));
                n = 0;
            }

            {
                const dropt_char* line = option->description;
                while (line != NULL)
                {
                    int lineLen;
                    const dropt_char* nextLine;
                    const dropt_char* newline = dropt_strchr(line, DROPT_TEXT_LITERAL('\n'));

                    if (newline == NULL)
                    {
                        lineLen = dropt_strlen(line);
                        nextLine = NULL;
                    }
                    else
                    {
                        lineLen = newline - line;
                        nextLine = newline + 1;
                    }

                    dropt_ssprintf(ss, DROPT_TEXT_LITERAL("%*s%.*s\n"),
                                   hp.description_start_column - n, DROPT_TEXT_LITERAL(""),
                                   lineLen, line);
                    n = 0;

                    line = nextLine;
                }
            }

        next:
            if (hp.blank_lines_between_options)
            {
                dropt_ssprintf(ss, DROPT_TEXT_LITERAL("\n"));
            }
        }
        helpText = dropt_ssfinalize(ss);
    }

    return helpText;
}